

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_per_ifetch(CPUS390XState_conflict *env,uint64_t addr)

{
  _Bool _Var1;
  byte bVar2;
  uint32_t uVar3;
  CPUState *cpu;
  CPUState *cs;
  uint64_t addr_local;
  CPUS390XState_conflict *env_local;
  
  if (((env->cregs[9] & 0x40000000) != 0) && (_Var1 = get_per_in_range(env,addr), _Var1)) {
    env->per_address = addr;
    bVar2 = get_per_atmid(env);
    env->per_perc_atmid = bVar2 | 0x4000;
    if ((env->cregs[9] & 0x1000000) != 0) {
      cpu = env_cpu(env);
      env->per_perc_atmid = env->per_perc_atmid | 0x100;
      env->int_pgm_code = 0x80;
      uVar3 = cpu_ldub_code_s390x(env,addr);
      uVar3 = get_ilen((uint8_t)uVar3);
      env->int_pgm_ilen = uVar3;
      cpu->exception_index = 3;
      cpu_loop_exit_s390x(cpu);
    }
  }
  return;
}

Assistant:

void HELPER(per_ifetch)(CPUS390XState *env, uint64_t addr)
{
    if ((env->cregs[9] & PER_CR9_EVENT_IFETCH) && get_per_in_range(env, addr)) {
        env->per_address = addr;
        env->per_perc_atmid = PER_CODE_EVENT_IFETCH | get_per_atmid(env);

        /* If the instruction has to be nullified, trigger the
           exception immediately. */
        if (env->cregs[9] & PER_CR9_EVENT_NULLIFICATION) {
            CPUState *cs = env_cpu(env);

            env->per_perc_atmid |= PER_CODE_EVENT_NULLIFICATION;
            env->int_pgm_code = PGM_PER;
            env->int_pgm_ilen = get_ilen(cpu_ldub_code(env, addr));

            cs->exception_index = EXCP_PGM;
            cpu_loop_exit(cs);
        }
    }
}